

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O1

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  DecodeStatus DVar3;
  uint8_t *orig_p;
  ulong uVar4;
  uint8_t *puVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint Op;
  uint8_t *puVar9;
  void *Decoder;
  uint64_t Value;
  ulong uVar10;
  ulong uVar11;
  uint Idx;
  uint64_t Value_4;
  uint8_t *orig_p_2;
  byte *pbVar12;
  ulong insn;
  bool bVar13;
  DecodeStatus S;
  DecodeStatus local_44;
  byte local_3e [6];
  uint64_t local_38;
  
  bVar6 = *code;
  bVar13 = 0xbf < bVar6;
  puVar9 = DecoderTable48;
  if (!bVar13) {
    puVar9 = DecoderTable32;
  }
  uVar7 = 2;
  if (0x3f < bVar6) {
    uVar7 = (ulong)(bVar13 + 4 + (uint)bVar13);
  }
  puVar5 = DecoderTable16;
  if (0x3f < bVar6) {
    puVar5 = puVar9;
  }
  *size = (uint16_t)uVar7;
  if (code_len < uVar7) {
LAB_001c3fd2:
    return false;
  }
  __s = MI->flat_insn->detail;
  local_38 = address;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  uVar8 = (ulong)*size;
  memcpy(local_3e,code,uVar8);
  uVar7 = 0;
  if (uVar8 == 0) {
    insn = 0;
  }
  else {
    uVar4 = 0;
    insn = 0;
    do {
      insn = insn << 8 | (ulong)local_3e[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
  }
  local_44 = MCDisassembler_Success;
  Decoder = (void *)0xffffffffffffffff;
LAB_001c3dbd:
  do {
LAB_001c3dc0:
    puVar9 = puVar5;
    switch(*puVar9) {
    case '\x01':
      goto switchD_001c3dd7_caseD_1;
    case '\x02':
      uVar8 = 0;
      uVar4 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar8 + 1;
        uVar4 = uVar4 + (long)(int)((puVar9[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar2] < '\0');
      puVar5 = puVar9 + (uVar8 & 0xffffffff) + 3;
      if (uVar4 != (uVar7 & 0xffffffff)) {
        puVar5 = puVar9 + (uVar8 & 0xffffffff) + 3 + *(ushort *)(puVar9 + (uVar8 & 0xffffffff) + 1);
      }
      goto LAB_001c3dc0;
    case '\x03':
      uVar8 = ~(-1L << (puVar9[2] & 0x3f)) << (puVar9[1] & 0x3f);
      if (puVar9[2] == 0x40) {
        uVar8 = 0xffffffffffffffff;
      }
      uVar10 = 0;
      uVar4 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar10 + 3;
        uVar4 = uVar4 + ((puVar9[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar9[lVar2] < '\0');
      puVar5 = puVar9 + (uVar10 & 0xffffffff) + 5;
      if ((uVar4 & 0xffffffff) != (uVar8 & insn) >> (puVar9[1] & 0x3f)) {
        puVar5 = puVar9 + (uVar10 & 0xffffffff) + 5 +
                 *(ushort *)(puVar9 + (uVar10 & 0xffffffff) + 3);
      }
      goto LAB_001c3dc0;
    case '\x04':
      uVar8 = 0;
      do {
        lVar2 = uVar8 + 1;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar2] < '\0');
      puVar5 = puVar9 + (uVar8 & 0xffffffff) + 3;
      goto LAB_001c3dc0;
    case '\x05':
      uVar7 = 0;
      Op = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar7 + 1;
        Op = Op + ((puVar9[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar7 = uVar7 + 1;
      } while ((char)puVar9[lVar2] < '\0');
      pbVar12 = puVar9 + (uVar7 & 0xffffffff) + 1;
      Idx = 0;
      bVar6 = 0;
      do {
        bVar1 = *pbVar12;
        Idx = Idx + ((bVar1 & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        pbVar12 = pbVar12 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(MI,Op);
      DVar3 = decodeToMCInst(local_44,Idx,insn,MI,local_38,Decoder);
      return DVar3 != MCDisassembler_Fail;
    case '\x06':
      uVar4 = 0;
      uVar8 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar4 + 1;
        uVar8 = uVar8 + (long)(int)((puVar9[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar4 = uVar4 + 1;
      } while ((char)puVar9[lVar2] < '\0');
      uVar11 = 0;
      uVar10 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar11 + (uVar4 & 0xffffffff) + 1;
        uVar10 = uVar10 + (long)(int)((puVar9[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar9[lVar2] < '\0');
      puVar5 = puVar9 + (uVar11 & 0xffffffff) + (uVar4 & 0xffffffff) + 1;
      if ((uVar10 & ~insn) != 0 || (uVar8 & insn) != 0) {
        local_44 = MCDisassembler_SoftFail;
      }
      break;
    default:
      goto LAB_001c3fd2;
    }
  } while( true );
switchD_001c3dd7_caseD_1:
  puVar5 = puVar9 + 3;
  uVar7 = ~(-1L << (puVar9[2] & 0x3f)) << (puVar9[1] & 0x3f);
  if (puVar9[2] == 0x40) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar7 = (uVar7 & insn) >> (puVar9[1] & 0x3f);
  goto LAB_001c3dbd;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	uint8_t Bytes[6];
	uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	memcpy(Bytes, code, *size);

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | Bytes[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}